

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O2

MatrixFixSize<4U,_3U> * iDynTree::Rotation::QuaternionRightTrivializedDerivative(Vector4 quaternion)

{
  MatrixFixSize<4U,_3U> *in_RDI;
  Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_> map;
  undefined1 local_b0 [16];
  undefined1 auStack_a0 [16];
  variable_if_dynamic<long,__1> local_90;
  ulong local_88;
  ulong uStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined8 local_70;
  Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true>
  local_68;
  
  local_b0._0_8_ = quaternion.m_data + 1;
  local_90.m_value = 1;
  uStack_80 = 4;
  local_68.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_true>
  .m_startRow.m_value = 0;
  local_68.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_true>
  .m_startCol.m_value = 0;
  local_68.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_true>
  .m_outerStride = 3;
  map._0_8_ = in_RDI;
  auStack_a0._0_8_ = &quaternion;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,3,1,4,3>,0,Eigen::Stride<0,0>>,1,3,true>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>,3,1,false>>const>>
            (&local_68,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>_>
              *)local_b0);
  in_RDI->m_data[3] = 1.0;
  in_RDI->m_data[4] = 0.0;
  in_RDI->m_data[5] = 0.0;
  in_RDI->m_data[6] = 0.0;
  in_RDI->m_data[7] = 1.0;
  in_RDI->m_data[10] = 0.0;
  in_RDI->m_data[8] = 0.0;
  in_RDI->m_data[9] = 0.0;
  in_RDI->m_data[0xb] = 1.0;
  auStack_a0._0_8_ = map._0_8_;
  auStack_a0._8_2_ = map._8_2_;
  local_90.m_value = 1;
  local_88 = 0;
  uStack_80 = 3;
  local_b0._0_8_ = in_RDI->m_data + 3;
  Eigen::
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_true>_>
  ::operator*=((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_true>_>
                *)local_b0,quaternion.m_data);
  local_b0._8_4_ = SUB84(quaternion.m_data[3],0);
  local_b0._0_8_ = (PointerType)0x0;
  local_b0._12_4_ = (uint)((ulong)quaternion.m_data[3] >> 0x20) ^ 0x80000000;
  auStack_a0._4_4_ = quaternion.m_data[2]._4_4_;
  auStack_a0._0_4_ = quaternion.m_data[2]._0_4_;
  auStack_a0._8_8_ = quaternion.m_data[3];
  local_90.m_value = 0;
  local_88 = CONCAT44(quaternion.m_data[1]._4_4_,quaternion.m_data[1]._0_4_) ^ 0x8000000000000000;
  uStack_80 = CONCAT44(quaternion.m_data[2]._4_4_,quaternion.m_data[2]._0_4_) ^ 0x8000000000000000;
  local_78 = quaternion.m_data[1]._0_4_;
  uStack_74 = quaternion.m_data[1]._4_4_;
  local_70 = 0;
  local_68.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_true>
  .m_xpr._0_8_ = map._0_8_;
  local_68.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_true>
  .m_xpr._8_2_ = map._8_2_;
  local_68.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_true>
  .m_startRow.m_value = 1;
  local_68.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_true>
  .m_startCol.m_value = 0;
  local_68.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_true>
  .m_outerStride = 3;
  local_68.
  super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>,_1,_3,_true>,_0>
  .m_data = in_RDI->m_data + 3;
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,3,1,4,3>,0,Eigen::Stride<0,0>>,3,3,true>>
  ::operator-=((MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,4,3,1,4,3>,0,Eigen::Stride<0,0>>,3,3,true>>
                *)&local_68,(MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_b0);
  local_b0._0_8_ = (PointerType)0x3fe0000000000000;
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>_>::
  operator*=((DenseBase<Eigen::Map<Eigen::Matrix<double,_4,_3,_1,_4,_3>,_0,_Eigen::Stride<0,_0>_>_>
              *)&map,(Scalar *)local_b0);
  return in_RDI;
}

Assistant:

MatrixFixSize<4, 3> Rotation::QuaternionRightTrivializedDerivative(Vector4 quaternion)
    {
        MatrixFixSize<4, 3> outputMatrix;
        Eigen::Map<Eigen::Matrix<double, 4, 3, Eigen::RowMajor> > map = iDynTree::toEigen(outputMatrix);
        map.topRows<1>() = -iDynTree::toEigen(quaternion).tail<3>().transpose();
        map.bottomRows<3>().setIdentity();
        map.bottomRows<3>() *= quaternion(0);
        map.bottomRows<3>() -= iDynTree::skew(iDynTree::toEigen(quaternion).tail<3>());
        map *= 0.5;
        return outputMatrix;
    }